

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planar_functions.cc
# Opt level: O0

int ByteToFloat(uint8_t *src_y,float *dst_y,float scale,int width)

{
  int in_EDX;
  float *in_RSI;
  uint8_t *in_RDI;
  float in_XMM0_Da;
  _func_void_uint8_t_ptr_float_ptr_float_int *ByteToFloatRow;
  undefined4 local_4;
  
  if (((in_RDI == (uint8_t *)0x0) || (in_RSI == (float *)0x0)) || (in_EDX < 1)) {
    local_4 = -1;
  }
  else {
    ByteToFloatRow_C(in_RDI,in_RSI,in_XMM0_Da,in_EDX);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

LIBYUV_API
int ByteToFloat(const uint8_t* src_y, float* dst_y, float scale, int width) {
  void (*ByteToFloatRow)(const uint8_t* src, float* dst, float scale,
                         int width) = ByteToFloatRow_C;
  if (!src_y || !dst_y || width <= 0) {
    return -1;
  }
#if defined(HAS_BYTETOFLOATROW_NEON)
  if (TestCpuFlag(kCpuHasNEON)) {
    ByteToFloatRow = ByteToFloatRow_Any_NEON;
    if (IS_ALIGNED(width, 8)) {
      ByteToFloatRow = ByteToFloatRow_NEON;
    }
  }
#endif

  ByteToFloatRow(src_y, dst_y, scale, width);
  return 0;
}